

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O3

bool rcg::saveFile(shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,string *data,
                  bool exception)

{
  char cVar1;
  long lVar2;
  ostream *poVar3;
  invalid_argument *piVar4;
  long *plVar5;
  char *pcVar6;
  long *plVar7;
  size_type sVar8;
  bool bVar9;
  FileProtocolAdapter rf;
  ostringstream out;
  FileProtocolAdapter aFStack_1d8 [16];
  undefined1 *local_1c8 [2];
  undefined1 local_1b8 [16];
  long *local_1a8;
  long local_1a0;
  long local_198;
  long lStack_190;
  
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(aFStack_1d8);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)aFStack_1d8);
  cVar1 = GenApi_3_4::FileProtocolAdapter::openFile((char *)aFStack_1d8,(_Ios_Openmode)name);
  if (cVar1 == '\0') {
    if (exception) {
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      local_1c8[0] = local_1b8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1c8,"Cannot open file for writing: ","");
      plVar5 = (long *)std::__cxx11::string::append((char *)local_1c8);
      local_1a8 = (long *)*plVar5;
      plVar7 = plVar5 + 2;
      if (local_1a8 == plVar7) {
        local_198 = *plVar7;
        lStack_190 = plVar5[3];
        local_1a8 = &local_198;
      }
      else {
        local_198 = *plVar7;
      }
      local_1a0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::invalid_argument::invalid_argument(piVar4,(string *)&local_1a8);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    bVar9 = false;
  }
  else {
    sVar8 = 0;
    do {
      pcVar6 = (char *)(data->_M_string_length - sVar8);
      if ((char *)0x1ff < pcVar6) {
        pcVar6 = (char *)0x200;
      }
      lVar2 = GenApi_3_4::FileProtocolAdapter::write
                        ((char *)aFStack_1d8,(long)((data->_M_dataplus)._M_p + sVar8),sVar8,pcVar6);
      sVar8 = sVar8 + lVar2;
    } while (lVar2 != 0);
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)aFStack_1d8);
    bVar9 = sVar8 == data->_M_string_length;
    if (exception && !bVar9) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_1a8,"Error: Can only write ",0x16);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," of ",4);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," bytes",6);
      piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::__cxx11::stringbuf::str();
      std::invalid_argument::invalid_argument(piVar4,(string *)local_1c8);
      __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(aFStack_1d8);
  return bVar9;
}

Assistant:

bool saveFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  const std::string &data, bool exception)
{
  bool ret=true;

  // store in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::out))
  {
    size_t off=0, n=512;
    while (n > 0)
    {
      n=rf.write(data.c_str()+off, off, std::min(static_cast<size_t>(512), data.size()-off), name);
      off+=n;
    }

    rf.closeFile(name);

    if (off != data.size())
    {
      if (exception)
      {
        std::ostringstream out;
        out << "Error: Can only write " << off << " of " << data.size() << " bytes";
        throw std::invalid_argument(out.str());
      }

      ret=false;
    }
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for writing: ")+name);
    }

    ret=false;
  }

  return ret;
}